

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

bool __thiscall
QTextStreamPrivate::scan
          (QTextStreamPrivate *this,QChar **ptr,qsizetype *length,qsizetype maxlen,
          TokenDelimiter delimiter)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  qsizetype qVar7;
  QChar *pQVar8;
  QTextStreamPrivate *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  qint64 in_stack_00000008;
  QChar *chPtr;
  qsizetype endOffset;
  qsizetype startOffset;
  bool foundToken;
  bool consumeDelimiter;
  qsizetype delimSize;
  qsizetype totalSize;
  QChar ch;
  QChar lastChar;
  QTextStreamPrivate *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  bool local_89;
  bool local_82;
  long local_80;
  QChar *local_70;
  long local_68;
  long local_60;
  long local_50;
  long local_48;
  bool local_13;
  QChar local_12;
  QChar local_10;
  QChar local_e;
  char16_t local_c;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0;
  local_50 = 0;
  bVar4 = false;
  bVar2 = false;
  if (*in_RDI == 0) {
    local_80 = in_RDI[2];
  }
  else {
    local_80 = in_RDI[0x1f];
  }
  local_60 = local_80;
  local_a.ucs = L'ꪪ';
  QChar::QChar(&local_a);
  do {
    if (*in_RDI == 0) {
      local_70 = QString::constData((QString *)0x13e936);
      local_68 = QString::size((QString *)in_RDI[1]);
    }
    else {
      local_70 = QString::constData((QString *)0x13e90b);
      local_68 = QString::size((QString *)(in_RDI + 0x1c));
    }
    local_70 = local_70 + local_60;
    while( true ) {
      local_82 = false;
      if ((!bVar2) && (local_82 = false, local_60 < local_68)) {
        local_82 = in_RCX == (QTextStreamPrivate *)0x0 || local_48 < (long)in_RCX;
      }
      if (!local_82) break;
      local_c = local_70->ucs;
      local_48 = local_48 + 1;
      if (in_R8D == 0) {
        bVar3 = QChar::isSpace((QChar *)0x13ea1d);
        if (bVar3) {
          bVar2 = true;
          local_50 = 1;
        }
      }
      else if (in_R8D == 1) {
        bVar3 = QChar::isSpace((QChar *)0x13ea43);
        if (!bVar3) {
          bVar2 = true;
          local_50 = 1;
        }
      }
      else if (in_R8D == 2) {
        QChar::QChar<char16_t,_true>(&local_e,L'\n');
        bVar3 = ::operator==((QChar *)CONCAT17(in_stack_ffffffffffffff67,
                                               CONCAT16(in_stack_ffffffffffffff66,
                                                        in_stack_ffffffffffffff60)),
                             (QChar *)in_stack_ffffffffffffff58);
        if (bVar3) {
          bVar2 = true;
          QChar::QChar<char16_t,_true>(&local_10,L'\r');
          bVar4 = ::operator==((QChar *)CONCAT17(in_stack_ffffffffffffff67,
                                                 CONCAT16(in_stack_ffffffffffffff66,
                                                          in_stack_ffffffffffffff60)),
                               (QChar *)in_stack_ffffffffffffff58);
          iVar5 = 1;
          if (bVar4) {
            iVar5 = 2;
          }
          local_50 = (long)iVar5;
          bVar4 = true;
        }
        local_a.ucs = local_c;
      }
      local_60 = local_60 + 1;
      local_70 = local_70 + 1;
    }
    local_89 = false;
    if ((!bVar2) &&
       (((in_RCX == (QTextStreamPrivate *)0x0 || (local_89 = false, local_48 < (long)in_RCX)) &&
        (local_89 = false, *in_RDI != 0)))) {
      local_89 = fillReadBuffer(in_RCX,in_stack_00000008);
    }
  } while (local_89 != false);
  if (local_48 == 0) {
    local_13 = false;
    goto LAB_0013ecad;
  }
  if (((in_R8D == 2) && (0 < local_48)) && (!bVar2)) {
    if ((in_RDI[1] == 0) ||
       (lVar1 = in_RDI[2], qVar7 = QString::size((QString *)in_RDI[1]), lVar1 + local_48 != qVar7))
    {
      in_stack_ffffffffffffff67 = false;
      if (*in_RDI != 0) {
        uVar6 = (**(code **)(*(long *)*in_RDI + 0x40))();
        in_stack_ffffffffffffff67 = false;
        if ((uVar6 & 1) != 0) goto LAB_0013ebeb;
      }
    }
    else {
LAB_0013ebeb:
      QChar::QChar<char16_t,_true>(&local_12,L'\r');
      in_stack_ffffffffffffff67 =
           ::operator==((QChar *)CONCAT17(in_stack_ffffffffffffff67,
                                          CONCAT16(in_stack_ffffffffffffff66,
                                                   in_stack_ffffffffffffff60)),
                        (QChar *)in_stack_ffffffffffffff58);
    }
    if ((bool)in_stack_ffffffffffffff67 != false) {
      bVar4 = true;
      local_50 = local_50 + 1;
    }
  }
  if (in_RDX != (long *)0x0) {
    *in_RDX = local_48 - local_50;
  }
  if (in_RSI != (undefined8 *)0x0) {
    pQVar8 = readPtr(in_stack_ffffffffffffff58);
    *in_RSI = pQVar8;
  }
  in_RDI[0x28] = local_48;
  if (!bVar4) {
    in_RDI[0x28] = in_RDI[0x28] - local_50;
  }
  local_13 = true;
LAB_0013ecad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_13;
  }
  __stack_chk_fail();
}

Assistant:

bool QTextStreamPrivate::scan(const QChar **ptr, qsizetype *length, qsizetype maxlen,
                              TokenDelimiter delimiter)
{
    qsizetype totalSize = 0;
    qsizetype delimSize = 0;
    bool consumeDelimiter = false;
    bool foundToken = false;
    qsizetype startOffset = device ? readBufferOffset : stringOffset;
    QChar lastChar;

    do {
        qsizetype endOffset;
        const QChar *chPtr;
        if (device) {
            chPtr = readBuffer.constData();
            endOffset = readBuffer.size();
        } else {
            chPtr = string->constData();
            endOffset = string->size();
        }
        chPtr += startOffset;

        for (; !foundToken && startOffset < endOffset && (!maxlen || totalSize < maxlen); ++startOffset) {
            const QChar ch = *chPtr++;
            ++totalSize;

            switch (delimiter) {
            case Space:
                if (ch.isSpace()) {
                    foundToken = true;
                    delimSize = 1;
                }
                break;
            case NotSpace:
                if (!ch.isSpace()) {
                    foundToken = true;
                    delimSize = 1;
                }
                break;
            case EndOfLine:
                if (ch == u'\n') {
                    foundToken = true;
                    delimSize = (lastChar == u'\r') ? 2 : 1;
                    consumeDelimiter = true;
                }
                lastChar = ch;
                break;
            }
        }
    } while (!foundToken
             && (!maxlen || totalSize < maxlen)
             && device && fillReadBuffer());

    if (totalSize == 0) {
#if defined (QTEXTSTREAM_DEBUG)
        qDebug("QTextStreamPrivate::scan() reached the end of input.");
#endif
        return false;
    }

    // if we find a '\r' at the end of the data when reading lines,
    // don't make it part of the line.
    if (delimiter == EndOfLine && totalSize > 0 && !foundToken) {
        if (((string && stringOffset + totalSize == string->size()) || (device && device->atEnd()))
            && lastChar == u'\r') {
            consumeDelimiter = true;
            ++delimSize;
        }
    }

    // set the read offset and length of the token
    if (length)
        *length = totalSize - delimSize;
    if (ptr)
        *ptr = readPtr();

    // update last token size. the callee will call consumeLastToken() when
    // done.
    lastTokenSize = totalSize;
    if (!consumeDelimiter)
        lastTokenSize -= delimSize;

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::scan(%p, %p, %d, %x) token length = %d, delimiter = %d",
           ptr, length, int(maxlen), uint(delimiter), int(totalSize - delimSize), int(delimSize));
#endif
    return true;
}